

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O0

bool __thiscall MinVR::VRPoint3::operator!=(VRPoint3 *this,VRPoint3 *p)

{
  long in_RSI;
  long in_RDI;
  double dVar1;
  undefined1 local_11;
  
  dVar1 = std::fabs((double)(ulong)(uint)(*(float *)(in_RSI + 8) - *(float *)(in_RDI + 8)));
  local_11 = true;
  if (SUB84(dVar1,0) < 1e-08) {
    dVar1 = std::fabs((double)(ulong)(uint)(*(float *)(in_RSI + 0xc) - *(float *)(in_RDI + 0xc)));
    local_11 = true;
    if (SUB84(dVar1,0) < 1e-08) {
      dVar1 = std::fabs((double)(ulong)(uint)(*(float *)(in_RSI + 0x10) - *(float *)(in_RDI + 0x10))
                       );
      local_11 = 1e-08 <= SUB84(dVar1,0);
    }
  }
  return local_11;
}

Assistant:

bool VRPoint3::operator!=(const VRPoint3& p) const {
  return (fabs(p.x - x) >= VRMATH_EPSILON || 
    fabs(p.y - y) >= VRMATH_EPSILON || 
    fabs(p.z - z) >= VRMATH_EPSILON);
}